

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makePreview.cpp
# Opt level: O0

void makePreview(char *inFileName,char *outFileName,int previewWidth,float exposure,bool verbose)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  Header *pHVar5;
  PreviewRgba *pPVar6;
  byte in_CL;
  uint in_EDX;
  char *in_RSI;
  char *in_RDI;
  OutputFile out_1;
  TiledOutputFile out;
  Header header;
  InputFile in;
  int previewHeight;
  Array2D<Imf_3_2::PreviewRgba> previewPixels;
  Array2D<Imf_3_2::PreviewRgba> *in_stack_fffffffffffffeb0;
  OutputFile local_d8 [16];
  TiledOutputFile local_c8 [32];
  PreviewImage local_a8 [16];
  Header local_98 [56];
  InputFile local_60 [36];
  uint local_3c;
  Array2D<Imf_3_2::PreviewRgba> *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  if (bVar1 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"generating preview image");
    std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
  }
  Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::Array2D
            ((Array2D<Imf_3_2::PreviewRgba> *)&stack0xffffffffffffffc8);
  anon_unknown.dwarf_41ee::generatePreview
            ((char *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile(local_60,in_RDI,iVar3);
  pHVar5 = (Header *)Imf_3_2::InputFile::header();
  Imf_3_2::Header::Header(local_98,pHVar5);
  pPVar6 = Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::operator[]
                     ((Array2D<Imf_3_2::PreviewRgba> *)&stack0xffffffffffffffc8,0);
  Imf_3_2::PreviewImage::PreviewImage(local_a8,in_EDX,local_3c,pPVar6);
  Imf_3_2::Header::setPreviewImage((PreviewImage *)local_98);
  Imf_3_2::PreviewImage::~PreviewImage(local_a8);
  if ((bVar1 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"copying ");
    poVar4 = std::operator<<(poVar4,in_RDI);
    poVar4 = std::operator<<(poVar4," to ");
    poVar4 = std::operator<<(poVar4,in_RSI);
    std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
  }
  bVar2 = Imf_3_2::Header::hasTileDescription();
  if ((bVar2 & 1) == 0) {
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::OutputFile::OutputFile(local_d8,in_RSI,local_98,iVar3);
    Imf_3_2::OutputFile::copyPixels((InputFile *)local_d8);
    Imf_3_2::OutputFile::~OutputFile(local_d8);
  }
  else {
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledOutputFile::TiledOutputFile(local_c8,in_RSI,local_98,iVar3);
    Imf_3_2::TiledOutputFile::copyPixels((InputFile *)local_c8);
    Imf_3_2::TiledOutputFile::~TiledOutputFile(local_c8);
  }
  if ((bVar1 & 1) != 0) {
    in_stack_fffffffffffffeb0 =
         (Array2D<Imf_3_2::PreviewRgba> *)std::operator<<((ostream *)&std::cout,"done.");
    std::ostream::operator<<
              ((ostream *)in_stack_fffffffffffffeb0,std::endl<char,std::char_traits<char>>);
  }
  Imf_3_2::Header::~Header(local_98);
  Imf_3_2::InputFile::~InputFile(local_60);
  Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::~Array2D(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void
makePreview (
    const char inFileName[],
    const char outFileName[],
    int        previewWidth,
    float      exposure,
    bool       verbose)
{
    if (verbose) cout << "generating preview image" << endl;

    Array2D<PreviewRgba> previewPixels;
    int                  previewHeight;

    generatePreview (
        inFileName, exposure, previewWidth, previewHeight, previewPixels);

    InputFile in (inFileName);
    Header    header = in.header ();

    header.setPreviewImage (
        PreviewImage (previewWidth, previewHeight, &previewPixels[0][0]));

    if (verbose)
        cout << "copying " << inFileName << " to " << outFileName << endl;

    if (header.hasTileDescription ())
    {
        TiledOutputFile out (outFileName, header);
        out.copyPixels (in);
    }
    else
    {
        OutputFile out (outFileName, header);
        out.copyPixels (in);
    }

    if (verbose) cout << "done." << endl;
}